

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::move_storage(torrent *this,string *save_path,move_flags_t flags)

{
  move_flags_t mVar1;
  bool bVar2;
  int iVar3;
  alert_manager *paVar4;
  undefined4 extraout_var;
  string *in_RCX;
  undefined1 auVar5 [16];
  string_view f;
  undefined1 local_148 [32];
  code *local_128;
  int64_t local_120;
  type local_118;
  function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
  local_f8;
  string local_d8 [36];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_b4;
  string local_b0 [8];
  string path_1;
  string local_80;
  duration local_60;
  string *path;
  operation_t local_35;
  basic_errors local_34;
  undefined1 local_30 [31];
  move_flags_t flags_local;
  string *save_path_local;
  torrent *this_local;
  
  local_30[0x17] = flags;
  unique0x100004d6 = (duration)(duration)save_path;
  save_path_local = (string *)this;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    bVar2 = valid_metadata(this);
    if (bVar2) {
      bVar2 = storage_holder::operator_cast_to_bool(&this->m_storage);
      if (bVar2) {
        ::std::__cxx11::string::string(local_b0,(string *)stack0xffffffffffffffe8);
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        local_b4.m_val = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
        ::std::__cxx11::string::string(local_d8,local_b0);
        mVar1 = local_30[0x17];
        local_128 = on_storage_moved;
        local_120 = 0;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                  ((enable_shared_from_this<libtorrent::aux::torrent> *)(local_148 + 0x10));
        ::std::
        bind<void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&),std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                  (&local_118,(offset_in_torrent_to_subr *)&local_128,
                   (shared_ptr<libtorrent::aux::torrent> *)(local_148 + 0x10),
                   (_Placeholder<1> *)&::std::placeholders::_1,
                   (_Placeholder<2> *)&::std::placeholders::_2,
                   (_Placeholder<3> *)&::std::placeholders::_3);
        ::std::
        function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>
        ::
        function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>,void>
                  ((function<void(libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::disk_storage_status_tag,void>,std::__cxx11::string_const&,libtorrent::storage_error_const&)>
                    *)&local_f8,&local_118);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                  ((long *)CONCAT44(extraout_var,iVar3),local_b4.m_val,local_d8,mVar1,&local_f8);
        ::std::
        function<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
        ::~function(&local_f8);
        ::std::
        _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_libtorrent::storage_error_&)>
        ::~_Bind(&local_118);
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)(local_148 + 0x10));
        ::std::__cxx11::string::~string(local_d8);
        this->field_0x600 = this->field_0x600 | 0x20;
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
        ::std::__cxx11::string::~string(local_b0);
      }
      else {
        paVar4 = alerts(this);
        bVar2 = alert_manager::should_post<libtorrent::storage_moved_alert>(paVar4);
        if (bVar2) {
          paVar4 = alerts(this);
          get_handle((torrent *)local_148);
          alert_manager::
          emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                    (paVar4,(torrent_handle *)local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     stack0xffffffffffffffe8,&this->m_save_path);
          torrent_handle::~torrent_handle((torrent_handle *)local_148);
        }
        ::std::__cxx11::string::operator=
                  ((string *)&this->m_save_path,(string *)stack0xffffffffffffffe8);
        set_need_save_resume(this,(resume_data_flags_t)0x20);
      }
    }
    else {
      paVar4 = alerts(this);
      bVar2 = alert_manager::should_post<libtorrent::storage_moved_alert>(paVar4);
      if (bVar2) {
        paVar4 = alerts(this);
        get_handle((torrent *)&path);
        in_RCX = &this->m_save_path;
        alert_manager::
        emplace_alert<libtorrent::storage_moved_alert,libtorrent::torrent_handle,std::__cxx11::string_const&,std::__cxx11::string&>
                  (paVar4,(torrent_handle *)&path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   stack0xffffffffffffffe8,in_RCX);
        torrent_handle::~torrent_handle((torrent_handle *)&path);
      }
      local_60 = stack0xffffffffffffffe8;
      auVar5 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)stack0xffffffffffffffe8);
      f._M_len = auVar5._8_8_;
      path_1.field_2._8_8_ = auVar5._0_8_;
      f._M_str = (char *)in_RCX;
      complete_abi_cxx11_(&local_80,(libtorrent *)path_1.field_2._8_8_,f);
      ::std::__cxx11::string::operator=((string *)&this->m_save_path,(string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_80);
    }
  }
  else {
    paVar4 = alerts(this);
    bVar2 = alert_manager::should_post<libtorrent::storage_moved_failed_alert>(paVar4);
    if (bVar2) {
      paVar4 = alerts(this);
      get_handle((torrent *)local_30);
      local_34 = operation_aborted;
      local_35 = unknown;
      alert_manager::
      emplace_alert<libtorrent::storage_moved_failed_alert,libtorrent::torrent_handle,boost::asio::error::basic_errors,char_const(&)[1],libtorrent::operation_t>
                (paVar4,(torrent_handle *)local_30,&local_34,(char (*) [1])0x86a1ad,&local_35);
      torrent_handle::~torrent_handle((torrent_handle *)local_30);
    }
  }
  return;
}

Assistant:

void torrent::move_storage(std::string const& save_path, move_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			if (alerts().should_post<storage_moved_failed_alert>())
				alerts().emplace_alert<storage_moved_failed_alert>(get_handle()
					, boost::asio::error::operation_aborted
					, "", operation_t::unknown);
			return;
		}

		// if we don't have metadata yet, we don't know anything about the file
		// structure and we have to assume we don't have any file.
		if (!valid_metadata())
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string const& path = save_path;
#endif
			m_save_path = complete(path);
			return;
		}

		// storage may be nullptr during shutdown
		if (m_storage)
		{
#if TORRENT_USE_UNC_PATHS
			std::string path = canonicalize_path(save_path);
#else
			std::string path = save_path;
#endif
			m_ses.disk_thread().async_move_storage(m_storage, std::move(path), flags
				, std::bind(&torrent::on_storage_moved, shared_from_this(), _1, _2, _3));
			m_moving_storage = true;
			m_ses.deferred_submit_jobs();
		}
		else
		{
			if (alerts().should_post<storage_moved_alert>())
				alerts().emplace_alert<storage_moved_alert>(get_handle(), save_path, m_save_path);

#if TORRENT_USE_UNC_PATHS
			m_save_path = canonicalize_path(save_path);
#else

			m_save_path = save_path;
#endif
			set_need_save_resume(torrent_handle::if_config_changed);
		}
	}